

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_join.cpp
# Opt level: O2

vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true> * __thiscall
duckdb::PhysicalJoin::GetSources
          (vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true>
           *__return_storage_ptr__,PhysicalJoin *this)

{
  int iVar1;
  const_reference pvVar2;
  reference_wrapper<const_duckdb::PhysicalOperator> local_18;
  
  pvVar2 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::get<true>
                     (&(this->super_CachingPhysicalOperator).super_PhysicalOperator.children,0);
  (*pvVar2->_M_data->_vptr_PhysicalOperator[0x25])(__return_storage_ptr__);
  iVar1 = (*(this->super_CachingPhysicalOperator).super_PhysicalOperator._vptr_PhysicalOperator
            [0x13])(this);
  if ((char)iVar1 != '\0') {
    local_18._M_data = (PhysicalOperator *)this;
    ::std::
    vector<std::reference_wrapper<duckdb::PhysicalOperator_const>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator_const>>>
    ::emplace_back<std::reference_wrapper<duckdb::PhysicalOperator_const>>
              ((vector<std::reference_wrapper<duckdb::PhysicalOperator_const>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator_const>>>
                *)__return_storage_ptr__,&local_18);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<const_reference<PhysicalOperator>> PhysicalJoin::GetSources() const {
	auto result = children[0].get().GetSources();
	if (IsSource()) {
		result.push_back(*this);
	}
	return result;
}